

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Totp.cpp
# Opt level: O0

ssize_t __thiscall Vault::Sys::Mfa::Totp::read(Totp *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__buf_00;
  undefined4 in_register_00000034;
  Url local_40;
  void *local_20;
  Path *path_local;
  Totp *this_local;
  
  path_local = (Path *)CONCAT44(in_register_00000034,__fd);
  __buf_00 = *(void **)path_local;
  local_20 = __buf;
  this_local = this;
  getUrl(&local_40,(Totp *)path_local,(Path *)__buf);
  Mfa::read((int)this,__buf_00,(size_t)&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Mfa::Totp::read(const Path &path) {
  return Vault::Sys::Mfa::read(client_, getUrl(path));
}